

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuilderFieldParsingCase
          (MessageBuilderGenerator *this,Printer *printer,FieldDescriptor *field)

{
  int field_number;
  Type type;
  WireType type_00;
  ImmutableFieldGenerator *pIVar1;
  AlphaNum *a;
  string_view local_a8 [2];
  string_view local_88;
  AlphaNum local_78;
  undefined1 local_48 [8];
  string tagString;
  uint32_t tag;
  FieldDescriptor *field_local;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  field_number = FieldDescriptor::number(field);
  type = FieldDescriptor::type(field);
  type_00 = protobuf::internal::WireFormat::WireTypeForFieldType(type);
  tagString.field_2._12_4_ = protobuf::internal::WireFormatLite::MakeTag(field_number,type_00);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_78,tagString.field_2._12_4_);
  absl::lts_20240722::StrCat_abi_cxx11_((string *)local_48,(lts_20240722 *)&local_78,a);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"case $tag$: {\n");
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,local_88,(char (*) [4])0x63b448,(string *)local_48);
  io::Printer::Indent(printer);
  pIVar1 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                     (&this->field_generators_,field);
  (*(pIVar1->super_FieldGenerator)._vptr_FieldGenerator[0xf])(pIVar1,printer);
  google::protobuf::io::Printer::Outdent();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_a8,"  break;\n} // case $tag$\n");
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,local_a8[0],(char (*) [4])0x63b448,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void MessageBuilderGenerator::GenerateBuilderFieldParsingCase(
    io::Printer* printer, const FieldDescriptor* field) {
  uint32_t tag = WireFormatLite::MakeTag(
      field->number(), WireFormat::WireTypeForFieldType(field->type()));
  std::string tagString = absl::StrCat(static_cast<int32_t>(tag));
  printer->Print("case $tag$: {\n", "tag", tagString);
  printer->Indent();

  field_generators_.get(field).GenerateBuilderParsingCode(printer);

  printer->Outdent();
  printer->Print(
      "  break;\n"
      "} // case $tag$\n",
      "tag", tagString);
}